

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateWriteToBody
          (MessageGenerator *this,Printer *printer,bool use_write_context)

{
  ulong uVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar2;
  size_type sVar3;
  const_reference ppFVar4;
  FieldGeneratorBase *__p;
  pointer pFVar5;
  char *pcVar6;
  string_view local_58;
  string_view local_48 [2];
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  local_28;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator;
  int i;
  bool use_write_context_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  generator._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
  _M_head_impl._0_4_ = 0;
  generator._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
  _M_head_impl._7_1_ = use_write_context;
  while( true ) {
    uVar1 = (ulong)(int)generator._M_t.
                        super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                        ._M_head_impl;
    pvVar2 = fields_by_number(this);
    sVar3 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(pvVar2);
    if (sVar3 <= uVar1) break;
    pvVar2 = fields_by_number(this);
    ppFVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](pvVar2,(long)(int)generator._M_t.
                                             super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                             .
                                             super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                                             ._M_head_impl);
    __p = CreateFieldGeneratorInternal(this,*ppFVar4);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&local_28,__p);
    pFVar5 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->(&local_28);
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xb])
              (pFVar5,printer,
               (ulong)(generator._M_t.
                       super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                       .
                       super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                       ._M_head_impl._7_1_ & 1));
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr(&local_28);
    generator._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
    _M_head_impl._0_4_ =
         (int)generator._M_t.
              super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
              .
              super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
              ._M_head_impl + 1;
  }
  if ((this->has_extension_ranges_ & 1U) != 0) {
    pcVar6 = "if (_extensions != null) {\n  _extensions.WriteTo(output);\n}\n";
    if ((generator._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
         _M_head_impl._7_1_ & 1) != 0) {
      pcVar6 = "if (_extensions != null) {\n  _extensions.WriteTo(ref output);\n}\n";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_48,pcVar6);
    io::Printer::Print<>(printer,local_48[0]);
  }
  pcVar6 = "if (_unknownFields != null) {\n  _unknownFields.WriteTo(output);\n}\n";
  if ((generator._M_t.
       super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
       .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
       _M_head_impl._7_1_ & 1) != 0) {
    pcVar6 = "if (_unknownFields != null) {\n  _unknownFields.WriteTo(ref output);\n}\n";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,pcVar6);
  io::Printer::Print<>(printer,local_58);
  return;
}

Assistant:

void MessageGenerator::GenerateWriteToBody(io::Printer* printer,
                                           bool use_write_context) {
  // Serialize all the fields
  for (int i = 0; i < fields_by_number().size(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fields_by_number()[i]));
    generator->GenerateSerializationCode(printer, use_write_context);
  }

  if (has_extension_ranges_) {
    // Serialize extensions
    printer->Print(use_write_context ? "if (_extensions != null) {\n"
                                       "  _extensions.WriteTo(ref output);\n"
                                       "}\n"
                                     : "if (_extensions != null) {\n"
                                       "  _extensions.WriteTo(output);\n"
                                       "}\n");
  }

  // Serialize unknown fields
  printer->Print(use_write_context ? "if (_unknownFields != null) {\n"
                                     "  _unknownFields.WriteTo(ref output);\n"
                                     "}\n"
                                   : "if (_unknownFields != null) {\n"
                                     "  _unknownFields.WriteTo(output);\n"
                                     "}\n");

  // TODO: Memoize size of frozen messages?
}